

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O3

void __thiscall Map::generateScene(Map *this)

{
  pointer *pppSVar1;
  iterator __position;
  uint uVar2;
  Scene *this_00;
  Decorator *pDVar3;
  Scene *local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"class:Map method:generateScene\n",0x1f);
  uVar2 = rand();
  if ((uVar2 & 1) == 0) {
    this_00 = (Scene *)operator_new(0x60);
    pDVar3 = (Decorator *)operator_new(8);
    pDVar3->_vptr_Decorator = (_func_int **)&PTR__Decorator_001156c0;
    Pasture::Pasture((Pasture *)this_00,pDVar3);
  }
  else {
    this_00 = (Scene *)operator_new(0x60);
    pDVar3 = (Decorator *)operator_new(8);
    pDVar3->_vptr_Decorator = (_func_int **)&PTR__Decorator_001156c0;
    Farm::Farm((Farm *)this_00,pDVar3);
  }
  __position._M_current =
       (this->scenes).super__Vector_base<Scene_*,_std::allocator<Scene_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->scenes).super__Vector_base<Scene_*,_std::allocator<Scene_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_20 = this_00;
    std::vector<Scene*,std::allocator<Scene*>>::_M_realloc_insert<Scene*>
              ((vector<Scene*,std::allocator<Scene*>> *)this,__position,&local_20);
  }
  else {
    *__position._M_current = this_00;
    pppSVar1 = &(this->scenes).super__Vector_base<Scene_*,_std::allocator<Scene_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  return;
}

Assistant:

void Map::generateScene(void) {
    std::cout << "class:Map method:generateScene\n";
    if (rand() % 2) {
        scenes.push_back(new Farm);
    } else {
        scenes.push_back(new Pasture);
    }
}